

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_2d_bilinear_apply_interpolation_p1
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined8 *in_RDX;
  long *in_RSI;
  long lVar5;
  long *in_RDI;
  float v1;
  float v0;
  float v11;
  float v10;
  float v01;
  float v00;
  float *value_ptr;
  int *offset_ptr;
  int x;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  float local_3d8;
  float local_3d4;
  float local_3d0;
  float local_3cc;
  int local_324;
  int *local_2d8;
  float *local_288;
  int local_22c;
  
  lVar2 = in_RSI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar3 = in_RSI[6];
  for (local_22c = 0; local_22c < (int)lVar2; local_22c = local_22c + 1) {
    lVar5 = *in_RDI + in_RDI[8] * (long)local_22c * in_RDI[2];
    local_288 = (float *)(*in_RSI + in_RSI[8] * (long)local_22c * in_RSI[2]);
    local_2d8 = (int *)*in_RDX;
    for (local_324 = 0; local_324 < iVar1 * (int)lVar3; local_324 = local_324 + 1) {
      pfVar4 = (float *)(local_2d8 + 4);
      if (*local_2d8 < 0) {
        local_3cc = 0.0;
      }
      else {
        local_3cc = *(float *)(lVar5 + (long)*local_2d8 * 4);
      }
      if (local_2d8[1] < 0) {
        local_3d0 = 0.0;
      }
      else {
        local_3d0 = *(float *)(lVar5 + (long)local_2d8[1] * 4);
      }
      if (local_2d8[2] < 0) {
        local_3d4 = 0.0;
      }
      else {
        local_3d4 = *(float *)(lVar5 + (long)local_2d8[2] * 4);
      }
      if (local_2d8[3] < 0) {
        local_3d8 = 0.0;
      }
      else {
        local_3d8 = *(float *)(lVar5 + (long)local_2d8[3] * 4);
      }
      *local_288 = (local_3cc * (1.0 - *pfVar4) + local_3d0 * *pfVar4) * (1.0 - (float)local_2d8[5])
                   + (local_3d4 * (1.0 - *pfVar4) + local_3d8 * *pfVar4) * (float)local_2d8[5];
      local_288 = local_288 + 1;
      local_2d8 = local_2d8 + 6;
    }
  }
  return;
}

Assistant:

static void gridsample_2d_bilinear_apply_interpolation_p1(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int x = 0; x < grid_size; x++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 4;

            float v00 = offset_ptr[0] >= 0 ? *(srcptr + offset_ptr[0]) : 0;
            float v01 = offset_ptr[1] >= 0 ? *(srcptr + offset_ptr[1]) : 0;
            float v10 = offset_ptr[2] >= 0 ? *(srcptr + offset_ptr[2]) : 0;
            float v11 = offset_ptr[3] >= 0 ? *(srcptr + offset_ptr[3]) : 0;

            float v0 = v00 * (1 - value_ptr[0]) + v01 * value_ptr[0];
            float v1 = v10 * (1 - value_ptr[0]) + v11 * value_ptr[0];

            *dstptr = v0 * (1 - value_ptr[1]) + v1 * value_ptr[1];

            dstptr++;
            offset_value_ptr += 6;
        }
    }
}